

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O2

void generate_flux(TrackData *trackdata)

{
  bool bVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  BitBuffer *this;
  char *pcVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint8_t uVar6;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *__args;
  uint8_t uVar7;
  uint32_t flux_time;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  int local_50;
  undefined1 local_4c [4];
  FluxData local_48;
  
  this = TrackData::bitstream(trackdata);
  iVar3 = bitcell_ns(this->datarate);
  BitBuffer::seek(this,0);
  flux_time = 0;
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = BitBuffer::size(this);
  __args = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(long)iVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,(size_type)__args);
  local_50 = iVar3;
  uVar2 = '\0';
  uVar6 = '\0';
  while( true ) {
    uVar7 = uVar2;
    bVar1 = BitBuffer::wrapped(this);
    if (bVar1) break;
    uVar2 = BitBuffer::read1(this);
    flux_time = flux_time + iVar3;
    iVar4 = extraout_EDX;
    if (uVar7 != '\0') {
      if ((trackdata->cylhead).cyl < 0x28) {
        __args = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&flux_time;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                   (value_type_conflict3 *)__args);
        flux_time = 0;
        iVar4 = extraout_EDX_00;
      }
      else {
        iVar3 = -0xf0;
        if (uVar6 != '\0') {
          iVar3 = 0xf0;
        }
        if (uVar6 == uVar2) {
          iVar3 = 0;
        }
        local_4c = (undefined1  [4])(flux_time + iVar3);
        __args = (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_4c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,(uint *)__args);
        flux_time = -iVar3;
        iVar3 = local_50;
        iVar4 = extraout_EDX_01;
      }
    }
    pcVar5 = BitBuffer::index(this,(char *)__args,iVar4);
    uVar6 = uVar7;
    if ((char)pcVar5 != '\0') {
      __args = &local_68;
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)__args);
      if (local_68._M_impl.super__Vector_impl_data._M_finish !=
          local_68._M_impl.super__Vector_impl_data._M_start) {
        local_68._M_impl.super__Vector_impl_data._M_finish =
             local_68._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if ((local_48.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_48.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_68._M_impl.super__Vector_impl_data._M_start !=
      local_68._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
  }
  TrackData::add(trackdata,&local_48,true);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void generate_flux(TrackData& trackdata)
{
    uint8_t last_bit{ 0 }, curr_bit{ 0 };
    auto& bitbuf = trackdata.bitstream();
    auto ns_per_bitcell = bitcell_ns(bitbuf.datarate);
    bitbuf.seek(0);

    uint32_t flux_time{ 0 };
    FluxData flux_data{};
    std::vector<uint32_t> flux_times{};
    flux_times.reserve(bitbuf.size());

    while (!bitbuf.wrapped())
    {
        auto next_bit{ bitbuf.read1() };

        flux_time += ns_per_bitcell;
        if (curr_bit)
        {
            if (trackdata.cylhead.cyl < 40)
            {
                flux_times.push_back(flux_time);
                flux_time = 0;
            }
            else
            {
                auto pre_comp_ns{ (last_bit == next_bit) ? 0 : (last_bit ? +240 : -240) };
                flux_times.push_back(flux_time + pre_comp_ns);
                flux_time = 0 - pre_comp_ns;
            }
        }

        last_bit = curr_bit;
        curr_bit = next_bit;

        if (bitbuf.index())
        {
            flux_data.push_back(std::move(flux_times));
            flux_times.clear();
        }
    }

    if (flux_data.empty() || !flux_times.empty())
        flux_data.push_back(std::move(flux_times));

    trackdata.add(std::move(flux_data), true);
}